

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O2

void __thiscall
TestClientContextState::TransactionRollback
          (TestClientContextState *this,undefined8 param_2,undefined8 param_3,long param_4)

{
  ErrorData *pEVar1;
  long local_10;
  
  if (param_4 != 0) {
    local_10 = param_4;
    pEVar1 = duckdb::optional_ptr<duckdb::ErrorData,_true>::operator->
                       ((optional_ptr<duckdb::ErrorData,_true> *)&local_10);
    if (*pEVar1 == (ErrorData)0x1) {
      pEVar1 = duckdb::optional_ptr<duckdb::ErrorData,_true>::operator->
                         ((optional_ptr<duckdb::ErrorData,_true> *)&local_10);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->transaction_errors,(value_type *)(pEVar1 + 0x28));
    }
  }
  return;
}

Assistant:

void TransactionRollback(MetaTransaction &transaction, ClientContext &context,
	                         optional_ptr<ErrorData> error) override {
		if (error && error->HasError()) {
			transaction_errors.push_back(error->Message());
		}
	}